

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::GetModesForExplicitContextCreate
          (EventLog *this,bool *inRecord,bool *activelyRecording,bool *inReplay)

{
  TTDMode TVar1;
  TTDMode TVar2;
  bool *inReplay_local;
  bool *activelyRecording_local;
  bool *inRecord_local;
  EventLog *this_local;
  
  TVar2 = this->m_currentMode;
  TVar1 = operator|(RecordMode,AnyExcludedMode);
  TVar2 = TTD::operator&(TVar2,TVar1);
  *inRecord = TVar2 == RecordMode;
  TVar2 = this->m_currentMode;
  TVar1 = operator|(RecordMode,CurrentlyEnabled);
  TVar1 = operator|(TVar1,AnyExcludedMode);
  TVar2 = TTD::operator&(TVar2,TVar1);
  TVar1 = operator|(RecordMode,CurrentlyEnabled);
  *activelyRecording = TVar2 == TVar1;
  TVar2 = this->m_currentMode;
  TVar1 = operator|(ReplayMode,AnyExcludedMode);
  TVar2 = TTD::operator&(TVar2,TVar1);
  *inReplay = TVar2 == ReplayMode;
  return;
}

Assistant:

void EventLog::GetModesForExplicitContextCreate(bool& inRecord, bool& activelyRecording, bool& inReplay)
    {
        inRecord = (this->m_currentMode & (TTDMode::RecordMode | TTDMode::AnyExcludedMode)) == TTDMode::RecordMode;
        activelyRecording = (this->m_currentMode & (TTDMode::RecordMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordMode | TTDMode::CurrentlyEnabled);
        inReplay = (this->m_currentMode & (TTDMode::ReplayMode | TTDMode::AnyExcludedMode)) == TTDMode::ReplayMode;
    }